

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.h
# Opt level: O0

void __thiscall Box::Box(Box *this,Vector *l,Vector *s1,Vector *s2,Vector *s3)

{
  Vector *local_b0;
  Vector local_a0;
  Vector local_88;
  Vector local_70;
  Vector local_58;
  Vector *local_30;
  Vector *s3_local;
  Vector *s2_local;
  Vector *s1_local;
  Vector *l_local;
  Box *this_local;
  
  local_30 = s3;
  s3_local = s2;
  s2_local = s1;
  s1_local = l;
  l_local = (Vector *)this;
  GeometricObject::GeometricObject(&this->super_GeometricObject);
  (this->super_GeometricObject)._vptr_GeometricObject = (_func_int **)&PTR__Box_00112970;
  Vector::Vector(&this->loc,s1_local);
  Vector::Vector(&this->e1,s2_local);
  Vector::Vector(&this->e2,s3_local);
  Vector::Vector(&this->e3,local_30);
  local_b0 = this->n;
  do {
    Vector::Vector(local_b0);
    local_b0 = local_b0 + 1;
  } while (local_b0 != (Vector *)this->d1);
  Vector::Vector(&this->center);
  operator+(&local_a0,&this->e1,&this->e2);
  operator+(&local_88,&local_a0,&this->e3);
  operator*(&local_70,&local_88,0.5);
  operator+(&local_58,&this->loc,&local_70);
  Vector::operator=(&this->center,&local_58);
  init_normals(this);
  return;
}

Assistant:

Box(Vector const& l, Vector const& s1, Vector const& s2, Vector const& s3)
        : loc( l )
        , e1( s1 )
        , e2( s2 )
        , e3( s3 )
    {
        center = loc + (e1 + e2 + e3) * 0.5;
        init_normals();
    }